

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphericalHarmonic.cpp
# Opt level: O3

ComplexType __thiscall
OpenMD::SphericalHarmonic::getValueAt(SphericalHarmonic *this,RealType costheta,RealType phi)

{
  undefined8 extraout_RDX;
  RealType RVar1;
  double dVar2;
  ComplexType CVar3;
  RealType local_28 [2];
  double local_18;
  double local_10;
  
  RVar1 = Ptilde(this,this->L,this->M,costheta);
  dVar2 = (double)this->M * phi;
  local_18 = cexp(0.0);
  local_28[1] = 0.0;
  local_28[0] = RVar1;
  local_10 = dVar2;
  CVar3._M_value._0_8_ =
       std::complex<double>::operator*=((complex<double> *)&local_18,(complex<double> *)local_28);
  CVar3._M_value._8_8_ = extraout_RDX;
  return (ComplexType)CVar3._M_value;
}

Assistant:

ComplexType SphericalHarmonic::getValueAt(RealType costheta, RealType phi) {
  RealType p;

  // associated Legendre polynomial
  p = Ptilde(L, M, costheta);
  ComplexType phase(0.0, (RealType)M * phi);

  return exp(phase) * (ComplexType)p;
}